

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_color.cpp
# Opt level: O2

void __thiscall Prog::Prog(Prog *this,Theme *theme,ALLEGRO_DISPLAY *display)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  int grid_x;
  long lVar4;
  Label *pLVar5;
  long local_f0;
  char **local_e8;
  long local_e0;
  VSlider local_d0;
  string local_90;
  string local_70;
  string local_50;
  
  Dialog::Dialog(&this->d,theme,display,0x280,0x1e0);
  lVar4 = 0x68;
  do {
    VSlider::VSlider((VSlider *)((long)&(this->d).theme + lVar4),0,1);
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x528);
  pLVar5 = (Label *)&this->field_0x528;
  lVar4 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"",(allocator<char> *)&local_d0);
    Label::Label(pLVar5,&local_50,true);
    std::__cxx11::string::~string((string *)&local_50);
    lVar4 = lVar4 + -0x60;
    pLVar5 = pLVar5 + 1;
  } while (lVar4 != -0x720);
  pLVar5 = (Label *)&this->field_0xc48;
  lVar4 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"",(allocator<char> *)&local_d0);
    Label::Label(pLVar5,&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
    lVar4 = lVar4 + -0x60;
    pLVar5 = pLVar5 + 1;
  } while (lVar4 != -0x720);
  lVar4 = 0x4da;
  local_f0 = 0x528;
  local_e8 = names;
  local_e0 = 0x68;
  uVar1 = 0;
  for (lVar2 = -0x260; lVar2 != 0; lVar2 = lVar2 + 0x20) {
    if (uVar1 < 0xc) {
      uVar3 = (uint)(byte)(((ushort)uVar1 & 0xff) / 3);
    }
    else {
      uVar3 = 5 - (uVar1 < 0x10);
    }
    VSlider::VSlider(&local_d0,1000,1000);
    *(ulong *)(&this->field_0x549 + lVar2 * 2) =
         CONCAT17((undefined1)local_d0.super_Widget.x2,local_d0.super_Widget._33_7_);
    *(undefined8 *)((long)(&this->field_0x549 + lVar2 * 2) + 8) = local_d0.super_Widget._41_8_;
    *(Dialog **)(&this->field_0x540 + lVar2 * 2) = local_d0.super_Widget.dialog;
    *(ulong *)((long)(&this->field_0x540 + lVar2 * 2) + 8) =
         CONCAT71(local_d0.super_Widget._33_7_,(undefined1)local_d0.super_Widget.x1);
    *(undefined8 *)(&this->field_0x530 + lVar2 * 2) = local_d0.super_Widget._8_8_;
    *(undefined8 *)((long)(&this->field_0x530 + lVar2 * 2) + 8) = local_d0.super_Widget._16_8_;
    *(undefined8 *)(&this->field_0x55c + lVar2 * 2) = local_d0._52_8_;
    Dialog::add(&this->d,(Widget *)((long)&(this->d).theme + local_e0),
                uVar3 * 0x10 + (int)lVar2 + 0x268,8,0xf,0x100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,*local_e8,(allocator<char> *)&local_d0);
    pLVar5 = (Label *)((long)&(this->d).theme + local_f0);
    Label::set_text(pLVar5,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    grid_x = uVar3 * 0x10 + (int)lVar2 + 0x260;
    Dialog::add(&this->d,(Widget *)pLVar5,grid_x,0x108,0x20,0x14);
    Dialog::add(&this->d,(Widget *)(&this->field_0x720 + local_f0),grid_x,0x11c,0x20,0x14);
    *(undefined4 *)((long)&(this->d).theme + lVar4 * 4) = 0;
    uVar1 = uVar1 + 1;
    lVar4 = lVar4 + 1;
    local_f0 = local_f0 + 0x60;
    local_e8 = local_e8 + 1;
    local_e0 = local_e0 + 0x40;
  }
  return;
}

Assistant:

Prog::Prog(const Theme & theme, ALLEGRO_DISPLAY *display) :
   d(Dialog(theme, display, 640, 480))
{
   for (int i = 0; i < SLIDERS_COUNT; i++) {
      int j = i < 12 ? i / 3 : i < 16 ? 4 : 5;
      sliders[i] = VSlider(1000, 1000);
      d.add(sliders[i], 8 + i * 32 + j * 16, 8, 15, 256);
      labels[i].set_text(names[i]);
      d.add(labels[i], i * 32 + j * 16, 8 + 256, 32, 20);
      d.add(labels2[i], i * 32 + j * 16, 8 + 276, 32, 20);
      previous[i] = 0;
   }
}